

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_stream.hpp
# Opt level: O3

size_t __thiscall
io::detail::memory_stream_impl<io::basic_string_view_stream<char,_std::char_traits<char>_>,_long>::
read_some<io::net::mutable_buffer>
          (memory_stream_impl<io::basic_string_view_stream<char,_std::char_traits<char>_>,_long>
           *this,mutable_buffer *mb,error_code *ec)

{
  error_category *peVar1;
  ulong uVar2;
  ulong uVar3;
  ulong __n;
  
  peVar1 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar1;
  uVar2 = this->pos_;
  uVar3 = this[1].pos_;
  if (uVar2 == uVar3) {
    std::error_code::operator=(ec,eof);
    uVar2 = this->pos_;
    uVar3 = this[1].pos_;
  }
  if (uVar3 < uVar2) {
    uVar2 = uVar3;
  }
  __n = uVar3 - uVar2;
  if (mb->size_ < uVar3 - uVar2) {
    __n = mb->size_;
  }
  memcpy(mb->data_,(void *)(uVar2 + this[2].pos_),__n);
  this->pos_ = this->pos_ + __n;
  return __n;
}

Assistant:

std::size_t read_some(const MutBufSeq& mb, std::error_code& ec) noexcept
    {
        static_assert(io::is_mutable_buffer_sequence_v<MutBufSeq>,
                      "Argument passed to read_some() is not a MutableBufferSequence");

        ec.clear();

        if (pos_ == this->size()) {
            ec = stream_errc::eof;
        }

        auto bytes_copied = io::buffer_copy(mb, this->buffer());
        pos_ += bytes_copied;

        return bytes_copied;
    }